

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O1

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::RemapOperands
          (LoopUnrollerUtilsImpl *this,Instruction *inst)

{
  pointer pOVar1;
  uint **ppuVar2;
  bool bVar3;
  char cVar4;
  uint **ppuVar5;
  pointer pOVar6;
  LoopUnrollerUtilsImpl **local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  uint *local_60;
  LoopUnrollerUtilsImpl *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  
  local_88 = &local_58;
  uStack_50 = 0;
  pcStack_40 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unroller.cpp:903:36)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unroller.cpp:903:36)>
             ::_M_manager;
  uStack_80 = 0;
  pcStack_70 = std::
               _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
             ::_M_manager;
  pOVar6 = (inst->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (inst->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_58 = this;
  if (pOVar6 != pOVar1) {
    do {
      bVar3 = spvIsInIdType(pOVar6->type);
      if (bVar3) {
        ppuVar2 = (uint **)(pOVar6->words).large_data_._M_t.
                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl;
        ppuVar5 = &(pOVar6->words).small_data_;
        if (ppuVar2 != (uint **)0x0) {
          ppuVar5 = ppuVar2;
        }
        local_60 = *ppuVar5;
        if (local_78 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        cVar4 = (*pcStack_70)(&local_88,&local_60);
        if (cVar4 == '\0') break;
      }
      pOVar6 = pOVar6 + 1;
    } while (pOVar6 != pOVar1);
  }
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,3);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  IRContext::AnalyzeUses(this->context_,inst);
  return;
}

Assistant:

void LoopUnrollerUtilsImpl::RemapOperands(Instruction* inst) {
  auto remap_operands_to_new_ids = [this](uint32_t* id) {
    auto itr = state_.new_inst.find(*id);

    if (itr != state_.new_inst.end()) {
      *id = itr->second;
    }
  };

  inst->ForEachInId(remap_operands_to_new_ids);
  context_->AnalyzeUses(inst);
}